

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

stbi__uint16 * stbi__convert_format16(stbi__uint16 *data,int img_n,int req_comp,uint x,uint y)

{
  ushort uVar1;
  int iVar2;
  stbi__uint16 *psVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  ushort *puVar8;
  stbi__uint16 *psVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ushort *puVar13;
  undefined1 auVar14 [16];
  
  if (req_comp != img_n) {
    if (3 < req_comp - 1U) {
      __assert_fail("req_comp >= 1 && req_comp <= 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/./ext/stb/stb_image.h"
                    ,0x5f6,
                    "stbi__uint16 *stbi__convert_format16(stbi__uint16 *, int, int, unsigned int, unsigned int)"
                   );
    }
    psVar3 = (stbi__uint16 *)malloc((ulong)(req_comp * x * y * 2));
    if (psVar3 == (stbi__uint16 *)0x0) {
      free(data);
      stbi__g_failure_reason = "outofmem";
      data = (stbi__uint16 *)0x0;
    }
    else {
      iVar2 = req_comp + img_n * 8;
      uVar4 = 0;
      if ((int)y < 1) {
        y = 0;
      }
      iVar5 = x - 1;
      uVar11 = 0;
      for (uVar12 = 0; uVar12 != y; uVar12 = uVar12 + 1) {
        if (0x19 < iVar2 - 10U) {
switchD_0012b0ee_caseD_d:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/./ext/stb/stb_image.h"
                        ,0x613,
                        "stbi__uint16 *stbi__convert_format16(stbi__uint16 *, int, int, unsigned int, unsigned int)"
                       );
        }
        uVar10 = (ulong)uVar4;
        iVar6 = (int)uVar12 * x;
        puVar13 = data + (uint)(iVar6 * img_n);
        psVar9 = psVar3 + (uint)(iVar6 * req_comp);
        switch(iVar2) {
        case 10:
          lVar7 = 0;
          for (iVar6 = iVar5; -1 < iVar6; iVar6 = iVar6 + -1) {
            psVar3[uVar10 + lVar7] = *(stbi__uint16 *)((long)data + lVar7 + uVar11 * 2);
            psVar3[uVar10 + lVar7 + 1] = 0xffff;
            lVar7 = lVar7 + 2;
          }
          break;
        case 0xb:
          puVar8 = psVar3 + uVar10 + 2;
          for (iVar6 = iVar5; -1 < iVar6; iVar6 = iVar6 + -1) {
            uVar1 = *puVar13;
            *puVar8 = uVar1;
            puVar8[-1] = uVar1;
            puVar8[-2] = uVar1;
            puVar13 = puVar13 + 1;
            puVar8 = puVar8 + 3;
          }
          break;
        case 0xc:
          lVar7 = 0;
          for (iVar6 = iVar5; -1 < iVar6; iVar6 = iVar6 + -1) {
            auVar14._8_8_ = 0;
            auVar14._0_8_ = (ulong)*(ushort *)((long)data + lVar7 + uVar11 * 2) | 0xffff0000;
            auVar14 = pshuflw(auVar14,auVar14,0x40);
            *(long *)(psVar3 + uVar10 + lVar7 * 2) = auVar14._0_8_;
            lVar7 = lVar7 + 2;
          }
          break;
        default:
          goto switchD_0012b0ee_caseD_d;
        case 0x11:
          lVar7 = 0;
          for (iVar6 = iVar5; -1 < iVar6; iVar6 = iVar6 + -1) {
            *(stbi__uint16 *)((long)psVar3 + lVar7 + uVar10 * 2) = data[uVar11 + lVar7];
            lVar7 = lVar7 + 2;
          }
          break;
        case 0x13:
          puVar8 = psVar3 + uVar10 + 2;
          for (iVar6 = iVar5; -1 < iVar6; iVar6 = iVar6 + -1) {
            uVar1 = *puVar13;
            *puVar8 = uVar1;
            puVar8[-1] = uVar1;
            puVar8[-2] = uVar1;
            puVar13 = puVar13 + 2;
            puVar8 = puVar8 + 3;
          }
          break;
        case 0x14:
          lVar7 = 0;
          for (iVar6 = iVar5; -1 < iVar6; iVar6 = iVar6 + -1) {
            auVar14 = ZEXT416(*(uint *)((long)data + lVar7 + uVar11 * 2));
            auVar14 = pshuflw(auVar14,auVar14,0x40);
            *(long *)(psVar3 + uVar10 + lVar7) = auVar14._0_8_;
            lVar7 = lVar7 + 4;
          }
          break;
        case 0x19:
          for (iVar6 = iVar5; -1 < iVar6; iVar6 = iVar6 + -1) {
            *psVar9 = (stbi__uint16)
                      ((uint)puVar13[2] * 0x1d + (uint)puVar13[1] * 0x96 + (uint)*puVar13 * 0x4d >>
                      8);
            puVar13 = puVar13 + 3;
            psVar9 = psVar9 + 1;
          }
          break;
        case 0x1a:
          for (iVar6 = iVar5; -1 < iVar6; iVar6 = iVar6 + -1) {
            *psVar9 = (stbi__uint16)
                      ((uint)puVar13[2] * 0x1d + (uint)puVar13[1] * 0x96 + (uint)*puVar13 * 0x4d >>
                      8);
            psVar9[1] = 0xffff;
            puVar13 = puVar13 + 3;
            psVar9 = psVar9 + 2;
          }
          break;
        case 0x1c:
          for (iVar6 = iVar5; -1 < iVar6; iVar6 = iVar6 + -1) {
            *(undefined4 *)psVar9 = *(undefined4 *)puVar13;
            psVar9[2] = puVar13[2];
            psVar9[3] = 0xffff;
            puVar13 = puVar13 + 3;
            psVar9 = psVar9 + 4;
          }
          break;
        case 0x21:
          lVar7 = 0;
          for (iVar6 = iVar5; -1 < iVar6; iVar6 = iVar6 + -1) {
            *(short *)((long)psVar3 + lVar7 + uVar10 * 2) =
                 (short)((uint)data[uVar11 + lVar7 * 2 + 2] * 0x1d +
                         (uint)data[uVar11 + lVar7 * 2 + 1] * 0x96 +
                         (uint)data[uVar11 + lVar7 * 2] * 0x4d >> 8);
            lVar7 = lVar7 + 2;
          }
          break;
        case 0x22:
          lVar7 = 0;
          for (iVar6 = iVar5; -1 < iVar6; iVar6 = iVar6 + -1) {
            *(short *)((long)psVar3 + lVar7 + uVar10 * 2) =
                 (short)((uint)data[uVar11 + lVar7 + 2] * 0x1d +
                         (uint)data[uVar11 + lVar7 + 1] * 0x96 + (uint)data[uVar11 + lVar7] * 0x4d
                        >> 8);
            *(stbi__uint16 *)((long)psVar3 + lVar7 + uVar10 * 2 + 2) = data[uVar11 + lVar7 + 3];
            lVar7 = lVar7 + 4;
          }
          break;
        case 0x23:
          for (iVar6 = iVar5; -1 < iVar6; iVar6 = iVar6 + -1) {
            *(undefined4 *)psVar9 = *(undefined4 *)puVar13;
            psVar9[2] = puVar13[2];
            puVar13 = puVar13 + 4;
            psVar9 = psVar9 + 3;
          }
        }
        uVar11 = (ulong)((int)uVar11 + x * img_n);
        uVar4 = uVar4 + req_comp * x;
      }
      free(data);
      data = psVar3;
    }
  }
  return data;
}

Assistant:

static stbi__uint16 *stbi__convert_format16(stbi__uint16 *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   stbi__uint16 *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (stbi__uint16 *) stbi__malloc(req_comp * x * y * 2);
   if (good == NULL) {
      STBI_FREE(data);
      return (stbi__uint16 *) stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      stbi__uint16 *src  = data + j * x * img_n   ;
      stbi__uint16 *dest = good + j * x * req_comp;

      #define STBI__COMBO(a,b)  ((a)*8+(b))
      #define STBI__CASE(a,b)   case STBI__COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (STBI__COMBO(img_n, req_comp)) {
         STBI__CASE(1,2) { dest[0]=src[0], dest[1]=0xffff;                                     } break;
         STBI__CASE(1,3) { dest[0]=dest[1]=dest[2]=src[0];                                     } break;
         STBI__CASE(1,4) { dest[0]=dest[1]=dest[2]=src[0], dest[3]=0xffff;                     } break;
         STBI__CASE(2,1) { dest[0]=src[0];                                                     } break;
         STBI__CASE(2,3) { dest[0]=dest[1]=dest[2]=src[0];                                     } break;
         STBI__CASE(2,4) { dest[0]=dest[1]=dest[2]=src[0], dest[3]=src[1];                     } break;
         STBI__CASE(3,4) { dest[0]=src[0],dest[1]=src[1],dest[2]=src[2],dest[3]=0xffff;        } break;
         STBI__CASE(3,1) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]);                   } break;
         STBI__CASE(3,2) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]), dest[1] = 0xffff; } break;
         STBI__CASE(4,1) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]);                   } break;
         STBI__CASE(4,2) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]), dest[1] = src[3]; } break;
         STBI__CASE(4,3) { dest[0]=src[0],dest[1]=src[1],dest[2]=src[2];                       } break;
         default: STBI_ASSERT(0);
      }
      #undef STBI__CASE
   }

   STBI_FREE(data);
   return good;
}